

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O3

double term(void)

{
  double dVar1;
  bool bVar2;
  runtime_error *prVar3;
  Token t;
  double local_c8;
  double local_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  Token local_98;
  uint local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  long *local_58 [2];
  long local_48 [3];
  
  local_c8 = primary();
  do {
    Token_stream::get(&local_98,&ts);
    if ((local_98._0_4_ & 0xff) == 0x25) {
      dVar1 = primary();
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"divide by zero","");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,(string *)local_b8);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_c8 = fmod(local_c8,dVar1);
LAB_001038e1:
      bVar2 = true;
    }
    else {
      if ((local_98._0_4_ & 0xff) == 0x2f) {
        dVar1 = primary();
        if ((dVar1 == 0.0) && (!NAN(dVar1))) {
          local_b8[0] = local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"divide by zero","");
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,(string *)local_b8);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_c8 = local_c8 / dVar1;
        goto LAB_001038e1;
      }
      if (local_98.kind == '*') {
        dVar1 = primary();
        local_c8 = local_c8 * dVar1;
        goto LAB_001038e1;
      }
      local_68 = local_98._0_4_;
      uStack_64 = local_98._4_4_;
      uStack_60 = local_98.value._0_4_;
      uStack_5c = local_98.value._4_4_;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,local_98.name._M_dataplus._M_p,
                 local_98.name._M_dataplus._M_p + local_98.name._M_string_length);
      ts.buffer._4_4_ = uStack_64;
      ts.buffer._0_4_ = local_68;
      ts.buffer.value = (double)CONCAT44(uStack_5c,uStack_60);
      std::__cxx11::string::_M_assign((string *)&ts.buffer.name);
      ts.full = true;
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar2 = false;
      local_c0 = local_c8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.name._M_dataplus._M_p != &local_98.name.field_2) {
      operator_delete(local_98.name._M_dataplus._M_p,local_98.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (!bVar2) {
      return local_c0;
    }
  } while( true );
}

Assistant:

double term()
{
	double left = primary();
	while (true)
	{
		Token t = ts.get();
		switch (t.kind)
		{
		case '*':
			left *= primary();
			break;
		case '/':
		{
			double d = primary();
			if (d == 0) error("divide by zero");
			left /= d;
			break;
		}
		case '%':
		{
			auto d = primary();
			if (d == 0)
				error("divide by zero");
			left = fmod(left, d);
			break;
		}
		default:
			ts.unget(t);
			return left;
		}
	}
}